

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O3

void __thiscall
cbtAlignedObjectArray<float>::~cbtAlignedObjectArray(cbtAlignedObjectArray<float> *this)

{
  if ((this->m_data != (float *)0x0) && (this->m_ownsMemory == true)) {
    cbtAlignedFreeInternal(this->m_data);
  }
  this->m_ownsMemory = true;
  this->m_data = (float *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  return;
}

Assistant:

~cbtAlignedObjectArray()
	{
		clear();
	}